

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderCreateInfoWrapper::ShaderCreateInfoWrapper
          (ShaderCreateInfoWrapper *this,ShaderCreateInfo *ShaderCI,IMemoryAllocator *RawAllocator)

{
  uint uVar1;
  void *__src;
  Char *pCVar2;
  void *__dest;
  ShaderMacro *pSVar3;
  undefined8 in_RCX;
  char (*Args_1) [79];
  size_t sVar4;
  long lVar5;
  size_t i_1;
  size_t i;
  ulong uVar6;
  bool bVar7;
  FixedLinearAllocator Allocator;
  string msg;
  
  memcpy(this,ShaderCI,0x98);
  RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory>::RefCntAutoPtr
            (&this->m_SourceFactory,ShaderCI->pShaderSourceStreamFactory);
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  Allocator.m_ReservedSize = 0;
  Allocator.m_CurrAlignment = 0;
  Allocator.m_pDataStart = (uint8_t *)0x0;
  Allocator.m_pCurrPtr = (uint8_t *)0x0;
  Allocator.m_DbgCurrAllocation = 0;
  Allocator.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Allocator.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Allocator.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Allocator.m_DbgUsingExternalMemory = false;
  Allocator.m_pAllocator = RawAllocator;
  FixedLinearAllocator::AddSpaceForString(&Allocator,ShaderCI->EntryPoint,0);
  FixedLinearAllocator::AddSpaceForString
            (&Allocator,(ShaderCI->Desc).super_DeviceObjectAttribs.Name,0);
  FixedLinearAllocator::AddSpaceForString(&Allocator,(ShaderCI->Desc).CombinedSamplerSuffix,0);
  FixedLinearAllocator::AddSpaceForString(&Allocator,ShaderCI->GLSLExtensions,0);
  FixedLinearAllocator::AddSpaceForString(&Allocator,ShaderCI->WebGPUEmulatedArrayIndexSuffix,0);
  if ((ShaderCI->ByteCode == (void *)0x0) || ((ShaderCI->field_4).SourceLength == 0)) {
    pCVar2 = ShaderCI->Source;
    if (pCVar2 == (Char *)0x0) {
      pCVar2 = ShaderCI->FilePath;
      if ((pCVar2 == (Char *)0x0) ||
         (ShaderCI->pShaderSourceStreamFactory == (IShaderSourceInputStreamFactory *)0x0)) {
        in_RCX = 0;
        LogError<true,char[93]>
                  (false,"ShaderCreateInfoWrapper",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ShaderBase.cpp"
                   ,0x3c,(char (*) [93])
                         "Shader create info must contain Source, Bytecode or FilePath with pShaderSourceStreamFactory"
                  );
        goto LAB_0045185d;
      }
      sVar4 = 0;
    }
    else {
      sVar4 = (ShaderCI->field_4).SourceLength;
    }
    FixedLinearAllocator::AddSpaceForString(&Allocator,pCVar2,sVar4);
  }
  else {
    FixedLinearAllocator::AddSpace(&Allocator,(ShaderCI->field_4).SourceLength,4);
  }
LAB_0045185d:
  bVar7 = (ShaderCI->Macros).Elements != (ShaderMacro *)0x0;
  Args_1 = (char (*) [79])CONCAT71((int7)((ulong)in_RCX >> 8),bVar7);
  uVar1 = (ShaderCI->Macros).Count;
  if (uVar1 != 0 && bVar7) {
    FixedLinearAllocator::AddSpace<Diligent::ShaderMacro>(&Allocator,(ulong)uVar1);
    lVar5 = 0;
    for (uVar6 = 0; uVar6 < (ShaderCI->Macros).Count; uVar6 = uVar6 + 1) {
      FixedLinearAllocator::AddSpaceForString
                (&Allocator,*(Char **)((long)&((ShaderCI->Macros).Elements)->Name + lVar5),0);
      FixedLinearAllocator::AddSpaceForString
                (&Allocator,*(Char **)((long)&((ShaderCI->Macros).Elements)->Definition + lVar5),0);
      lVar5 = lVar5 + 0x10;
    }
  }
  FixedLinearAllocator::Reserve(&Allocator);
  Allocator.m_pAllocator = (IMemoryAllocator *)0x0;
  msg._M_string_length = (size_type)Allocator.m_pDataStart;
  msg._M_dataplus._M_p = (pointer)RawAllocator;
  std::__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
            ((__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
             &this->m_pRawMemory,
             (__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)&msg)
  ;
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)&msg);
  pCVar2 = FixedLinearAllocator::CopyString(&Allocator,ShaderCI->EntryPoint,0);
  (this->m_CreateInfo).EntryPoint = pCVar2;
  pCVar2 = FixedLinearAllocator::CopyString
                     (&Allocator,(ShaderCI->Desc).super_DeviceObjectAttribs.Name,0);
  (this->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name = pCVar2;
  pCVar2 = FixedLinearAllocator::CopyString(&Allocator,(ShaderCI->Desc).CombinedSamplerSuffix,0);
  (this->m_CreateInfo).Desc.CombinedSamplerSuffix = pCVar2;
  pCVar2 = FixedLinearAllocator::CopyString(&Allocator,ShaderCI->GLSLExtensions,0);
  (this->m_CreateInfo).GLSLExtensions = pCVar2;
  pCVar2 = FixedLinearAllocator::CopyString(&Allocator,ShaderCI->WebGPUEmulatedArrayIndexSuffix,0);
  (this->m_CreateInfo).WebGPUEmulatedArrayIndexSuffix = pCVar2;
  if ((this->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name == (Char *)0x0) {
    (this->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name = "";
  }
  __src = ShaderCI->ByteCode;
  if ((__src == (void *)0x0) || (sVar4 = (ShaderCI->field_4).SourceLength, sVar4 == 0)) {
    if (ShaderCI->Source == (char *)0x0) {
      pCVar2 = ShaderCI->FilePath;
      if ((pCVar2 == (Char *)0x0) ||
         (ShaderCI->pShaderSourceStreamFactory == (IShaderSourceInputStreamFactory *)0x0)) {
        FormatString<char[26],char[79]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ShaderCI.FilePath != nullptr && ShaderCI.pShaderSourceStreamFactory != nullptr",
                   Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"ShaderCreateInfoWrapper",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ShaderBase.cpp"
                   ,0x62);
        std::__cxx11::string::~string((string *)&msg);
        pCVar2 = ShaderCI->FilePath;
      }
      pCVar2 = FixedLinearAllocator::CopyString(&Allocator,pCVar2,0);
      (this->m_CreateInfo).FilePath = pCVar2;
    }
    else {
      pCVar2 = FixedLinearAllocator::CopyString
                         (&Allocator,ShaderCI->Source,(ShaderCI->field_4).SourceLength);
      (this->m_CreateInfo).Source = pCVar2;
      (this->m_CreateInfo).field_4 = ShaderCI->field_4;
    }
  }
  else {
    __dest = FixedLinearAllocator::Allocate(&Allocator,sVar4,4);
    memcpy(__dest,__src,sVar4);
    (this->m_CreateInfo).ByteCode = __dest;
  }
  uVar1 = (ShaderCI->Macros).Count;
  if (uVar1 != 0 && (ShaderCI->Macros).Elements != (ShaderMacro *)0x0) {
    pSVar3 = FixedLinearAllocator::ConstructArray<Diligent::ShaderMacro>(&Allocator,(ulong)uVar1);
    (this->m_CreateInfo).Macros.Elements = pSVar3;
    lVar5 = 0;
    for (uVar6 = 0; uVar6 < (ShaderCI->Macros).Count; uVar6 = uVar6 + 1) {
      pCVar2 = FixedLinearAllocator::CopyString
                         (&Allocator,*(char **)((long)&((ShaderCI->Macros).Elements)->Name + lVar5),
                          0);
      *(Char **)((long)&pSVar3->Name + lVar5) = pCVar2;
      pCVar2 = FixedLinearAllocator::CopyString
                         (&Allocator,
                          *(char **)((long)&((ShaderCI->Macros).Elements)->Definition + lVar5),0);
      *(Char **)((long)&pSVar3->Definition + lVar5) = pCVar2;
      lVar5 = lVar5 + 0x10;
    }
  }
  FixedLinearAllocator::~FixedLinearAllocator(&Allocator);
  return;
}

Assistant:

ShaderCreateInfoWrapper::ShaderCreateInfoWrapper(const ShaderCreateInfo& ShaderCI,
                                                 IMemoryAllocator&       RawAllocator) noexcept(false) :
    m_CreateInfo{ShaderCI},
    m_SourceFactory{ShaderCI.pShaderSourceStreamFactory}
{
    FixedLinearAllocator Allocator{RawAllocator};

    Allocator.AddSpaceForString(ShaderCI.EntryPoint);
    Allocator.AddSpaceForString(ShaderCI.Desc.Name);
    Allocator.AddSpaceForString(ShaderCI.Desc.CombinedSamplerSuffix);
    Allocator.AddSpaceForString(ShaderCI.GLSLExtensions);
    Allocator.AddSpaceForString(ShaderCI.WebGPUEmulatedArrayIndexSuffix);

    if (ShaderCI.ByteCode && ShaderCI.ByteCodeSize > 0)
    {
        Allocator.AddSpace(ShaderCI.ByteCodeSize, alignof(Uint32));
    }
    else if (ShaderCI.Source != nullptr)
    {
        Allocator.AddSpaceForString(ShaderCI.Source, ShaderCI.SourceLength);
    }
    else if (ShaderCI.FilePath != nullptr && ShaderCI.pShaderSourceStreamFactory != nullptr)
    {
        Allocator.AddSpaceForString(ShaderCI.FilePath);
    }
    else
    {
        LOG_ERROR_AND_THROW("Shader create info must contain Source, Bytecode or FilePath with pShaderSourceStreamFactory");
    }

    if (ShaderCI.Macros)
    {
        Allocator.AddSpace<ShaderMacro>(ShaderCI.Macros.Count);

        for (size_t i = 0; i < ShaderCI.Macros.Count; ++i)
        {
            Allocator.AddSpaceForString(ShaderCI.Macros[i].Name);
            Allocator.AddSpaceForString(ShaderCI.Macros[i].Definition);
        }
    }

    Allocator.Reserve();

    m_pRawMemory = decltype(m_pRawMemory){Allocator.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

    m_CreateInfo.EntryPoint                     = Allocator.CopyString(ShaderCI.EntryPoint);
    m_CreateInfo.Desc.Name                      = Allocator.CopyString(ShaderCI.Desc.Name);
    m_CreateInfo.Desc.CombinedSamplerSuffix     = Allocator.CopyString(ShaderCI.Desc.CombinedSamplerSuffix);
    m_CreateInfo.GLSLExtensions                 = Allocator.CopyString(ShaderCI.GLSLExtensions);
    m_CreateInfo.WebGPUEmulatedArrayIndexSuffix = Allocator.CopyString(ShaderCI.WebGPUEmulatedArrayIndexSuffix);

    if (m_CreateInfo.Desc.Name == nullptr)
        m_CreateInfo.Desc.Name = "";

    if (ShaderCI.ByteCode && ShaderCI.ByteCodeSize > 0)
    {
        m_CreateInfo.ByteCode = Allocator.Copy(ShaderCI.ByteCode, ShaderCI.ByteCodeSize, alignof(Uint32));
    }
    else if (ShaderCI.Source != nullptr)
    {
        m_CreateInfo.Source       = Allocator.CopyString(ShaderCI.Source, ShaderCI.SourceLength);
        m_CreateInfo.SourceLength = ShaderCI.SourceLength;
    }
    else
    {
        VERIFY_EXPR(ShaderCI.FilePath != nullptr && ShaderCI.pShaderSourceStreamFactory != nullptr);
        m_CreateInfo.FilePath = Allocator.CopyString(ShaderCI.FilePath);
    }

    if (ShaderCI.Macros)
    {
        ShaderMacro* pMacros         = Allocator.ConstructArray<ShaderMacro>(ShaderCI.Macros.Count);
        m_CreateInfo.Macros.Elements = pMacros;
        for (size_t i = 0; i < ShaderCI.Macros.Count; ++i)
        {
            pMacros[i].Name       = Allocator.CopyString(ShaderCI.Macros[i].Name);
            pMacros[i].Definition = Allocator.CopyString(ShaderCI.Macros[i].Definition);
        }
    }
}